

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  Value *in_RDI;
  StyledStreamWriter *unaff_retaddr;
  uint index_1;
  Value *childValue;
  uint index;
  bool hasChildValue;
  bool isArrayMultiLine;
  uint size;
  Value *in_stack_00000138;
  StyledStreamWriter *in_stack_00000140;
  string *in_stack_ffffffffffffff28;
  StyledStreamWriter *in_stack_ffffffffffffff30;
  ostream *poVar4;
  StyledStreamWriter *this_00;
  Value *in_stack_ffffffffffffff48;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff5c;
  StyledStreamWriter *in_stack_ffffffffffffff60;
  ArrayIndex AVar7;
  undefined2 in_stack_ffffffffffffff8c;
  allocator<char> in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  ArrayIndex in_stack_ffffffffffffff94;
  Value *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [48];
  Value *root;
  
  root = in_RDI;
  local_38._36_4_ = Value::size(in_stack_ffffffffffffff48);
  if (local_38._36_4_ == 0) {
    paVar5 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"[]",paVar5);
    pushValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    bVar1 = isMultineArray(in_stack_ffffffffffffff60,
                           (Value *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) {
      this_00 = (StyledStreamWriter *)&stack0xffffffffffffff8f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"[",(allocator *)this_00);
      writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
      indent((StyledStreamWriter *)0x13391e);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->childValues_);
      bVar2 = (bVar1 ^ 0xffU) & 1;
      AVar7 = 0;
      while( true ) {
        Value::operator[](in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        writeCommentBeforeValue
                  ((StyledStreamWriter *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (Value *)CONCAT17(in_stack_ffffffffffffff8f,
                                     CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffff8c,AVar7))));
        if ((bVar2 & 1) == 0) {
          writeIndent(in_stack_ffffffffffffff30);
          writeValue(in_stack_00000140,in_stack_00000138);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_RDI,(ulong)AVar7);
          writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        AVar7 = AVar7 + 1;
        if (AVar7 == local_38._36_4_) break;
        std::operator<<((ostream *)in_RDI->start_,",");
        writeCommentAfterValueOnSameLine(unaff_retaddr,root);
      }
      writeCommentAfterValueOnSameLine(unaff_retaddr,root);
      unindent(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff60,"]",(allocator *)&stack0xffffffffffffff5f);
      writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
    else {
      std::operator<<((ostream *)in_RDI->start_,"[ ");
      for (uVar6 = 0; uVar6 < (uint)local_38._36_4_; uVar6 = uVar6 + 1) {
        if (uVar6 != 0) {
          std::operator<<((ostream *)in_RDI->start_,", ");
        }
        poVar4 = (ostream *)in_RDI->start_;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_RDI,(ulong)uVar6);
        std::operator<<(poVar4,(string *)pvVar3);
      }
      std::operator<<((ostream *)in_RDI->start_," ]");
    }
  }
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}